

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrInteractionProfileSuggestedBinding *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  pointer pcVar3;
  PFN_xrStructureTypeToString p_Var4;
  void *value_00;
  XrActionSuggestedBinding *pXVar5;
  XrStructureType __val;
  uint uVar6;
  char cVar7;
  bool bVar8;
  char *pcVar9;
  XrInstance pXVar10;
  invalid_argument *piVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  uint uVar17;
  string suggestedbindings_prefix;
  string next_prefix;
  string suggestedbindings_array_prefix;
  string countsuggestedbindings_prefix;
  string interactionprofile_prefix;
  string type_prefix;
  string __str_2;
  ostringstream oss_countSuggestedBindings;
  ostringstream oss_suggestedBindings_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  long *local_448;
  long local_440;
  long local_438 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  long *local_3a8;
  uint local_3a0;
  long local_398 [2];
  undefined1 local_388 [16];
  PFN_xrEnumerateInstanceExtensionProperties local_378;
  string local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  PFN_xrGetReferenceSpaceBoundsRect local_308;
  PFN_xrCreateActionSpace p_Stack_300;
  PFN_xrLocateSpace local_2f8;
  PFN_xrDestroySpace p_Stack_2f0;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_328,'\x12');
  *local_328._M_dataplus._M_p = '0';
  local_328._M_dataplus._M_p[1] = 'x';
  pcVar9 = local_328._M_dataplus._M_p + local_328._M_string_length + -1;
  lVar13 = 0;
  do {
    bVar1 = local_1a8[lVar13];
    *pcVar9 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar9[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar13 = lVar13 + 1;
    pcVar9 = pcVar9 + -2;
  } while (lVar13 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3c8);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar2 = value->type;
    __val = -XVar2;
    if (0 < (int)XVar2) {
      __val = XVar2;
    }
    uVar17 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar15 = (ulong)__val;
      uVar6 = 4;
      do {
        uVar17 = uVar6;
        uVar12 = (uint)uVar15;
        if (uVar12 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0013dbe1;
        }
        if (uVar12 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0013dbe1;
        }
        if (uVar12 < 10000) goto LAB_0013dbe1;
        uVar15 = uVar15 / 10000;
        uVar6 = uVar17 + 4;
      } while (99999 < uVar12);
      uVar17 = uVar17 + 1;
    }
LAB_0013dbe1:
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_328,(char)uVar17 - (char)((int)XVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_328._M_dataplus._M_p + (XVar2 >> 0x1f),uVar17,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_3c8,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_2f8 = (PFN_xrLocateSpace)0x0;
    p_Stack_2f0 = (PFN_xrDestroySpace)0x0;
    local_308 = (PFN_xrGetReferenceSpaceBoundsRect)0x0;
    p_Stack_300 = (PFN_xrCreateActionSpace)0x0;
    local_328.field_2._M_allocated_capacity = 0;
    local_328.field_2._8_8_ = 0;
    local_328._M_dataplus._M_p = (pointer)0x0;
    local_328._M_string_length = 0;
    p_Var4 = gen_dispatch_table->StructureTypeToString;
    pXVar10 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var4)(pXVar10,value->type,(char *)&local_328);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_3c8,(char (*) [64])&local_328);
  }
  local_448 = local_438;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_448,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_448);
  value_00 = value->next;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_448,local_440 + (long)local_448);
  bVar8 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_348,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (!bVar8) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar11,"Invalid Operation");
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3e8);
  uVar15 = value->interactionProfile;
  cVar16 = '\x01';
  if (9 < uVar15) {
    uVar14 = uVar15;
    cVar7 = '\x04';
    do {
      cVar16 = cVar7;
      if (uVar14 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_0013dd99;
      }
      if (uVar14 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_0013dd99;
      }
      if (uVar14 < 10000) goto LAB_0013dd99;
      bVar8 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar7 = cVar16 + '\x04';
    } while (bVar8);
    cVar16 = cVar16 + '\x01';
  }
LAB_0013dd99:
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_328,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_328._M_dataplus._M_p,(uint)local_328._M_string_length,uVar15);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])"XrPath",&local_3e8,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_408,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_408);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"0x",2);
  *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_328);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_408,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((XrInteractionProfileSuggestedBinding *)local_1a8._0_8_ !=
      (XrInteractionProfileSuggestedBinding *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_468,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_468);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + *(XrPath *)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 + *(XrPath *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[32],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [32])"const XrActionSuggestedBinding*",&local_468,&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if (value->countSuggestedBindings != 0) {
    uVar15 = 0;
    do {
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_428,local_468._M_dataplus._M_p,
                 local_468._M_dataplus._M_p + local_468._M_string_length);
      std::__cxx11::string::append((char *)&local_428);
      cVar16 = '\x01';
      if (9 < uVar15) {
        uVar14 = uVar15;
        cVar7 = '\x04';
        do {
          cVar16 = cVar7;
          uVar17 = (uint)uVar14;
          if (uVar17 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_0013e030;
          }
          if (uVar17 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_0013e030;
          }
          if (uVar17 < 10000) goto LAB_0013e030;
          uVar14 = (uVar14 & 0xffffffff) / 10000;
          cVar7 = cVar16 + '\x04';
        } while (99999 < uVar17);
        cVar16 = cVar16 + '\x01';
      }
LAB_0013e030:
      local_3a8 = local_398;
      std::__cxx11::string::_M_construct((ulong)&local_3a8,cVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_3a8,local_3a0,(uint)uVar15);
      std::__cxx11::string::_M_append((char *)&local_428,(ulong)local_3a8);
      if (local_3a8 != local_398) {
        operator_delete(local_3a8,local_398[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_428);
      pXVar5 = value->suggestedBindings;
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_388 + 0x20),local_428._M_dataplus._M_p,
                 local_428._M_dataplus._M_p + local_428._M_string_length);
      local_388._0_8_ = local_388 + 0x10;
      gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_388;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_388,"const XrActionSuggestedBinding*","");
      bVar8 = ApiDumpOutputXrStruct
                        (gen_dispatch_table_00,pXVar5 + uVar15,(string *)(local_388 + 0x20),
                         (string *)local_388,false,contents);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,(ulong)(local_378 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,
                        (ulong)(local_368.field_2._M_allocated_capacity + 1));
      }
      if (!bVar8) {
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar11,"Invalid Operation");
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < value->countSuggestedBindings);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
  std::ios_base::~ios_base(local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if (local_448 != local_438) {
    operator_delete(local_448,local_438[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrInteractionProfileSuggestedBinding* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string interactionprofile_prefix = prefix;
        interactionprofile_prefix += "interactionProfile";
        contents.emplace_back("XrPath", interactionprofile_prefix, std::to_string(value->interactionProfile));
        std::string countsuggestedbindings_prefix = prefix;
        countsuggestedbindings_prefix += "countSuggestedBindings";
        std::ostringstream oss_countSuggestedBindings;
        oss_countSuggestedBindings << "0x" << std::hex << (value->countSuggestedBindings);
        contents.emplace_back("uint32_t", countsuggestedbindings_prefix, oss_countSuggestedBindings.str());
        std::string suggestedbindings_prefix = prefix;
        suggestedbindings_prefix += "suggestedBindings";
        std::ostringstream oss_suggestedBindings_array;
        oss_suggestedBindings_array << std::hex << reinterpret_cast<const void*>(value->suggestedBindings);
        contents.emplace_back("const XrActionSuggestedBinding*", suggestedbindings_prefix, oss_suggestedBindings_array.str());
        for (uint32_t value_suggestedbindings_inc = 0; value_suggestedbindings_inc < value->countSuggestedBindings; ++value_suggestedbindings_inc) {
            std::string suggestedbindings_array_prefix = suggestedbindings_prefix;
            suggestedbindings_array_prefix += "[";
            suggestedbindings_array_prefix += std::to_string(value_suggestedbindings_inc);
            suggestedbindings_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->suggestedBindings[value_suggestedbindings_inc], suggestedbindings_array_prefix, "const XrActionSuggestedBinding*", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}